

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O1

void libtorrent::aux::create_symlink(string *target,string *link,storage_error *ec)

{
  size_t __n;
  int iVar1;
  int *piVar2;
  size_t sVar3;
  char buffer [512];
  string local_228 [16];
  
  parent_path(local_228,link);
  create_directories(local_228,&ec->ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
    operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
  }
  if ((ec->ec).val_ == 0) {
    iVar1 = symlink((target->_M_dataplus)._M_p,(link->_M_dataplus)._M_p);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (iVar1 == 0x11) {
        sVar3 = readlink((link->_M_dataplus)._M_p,(char *)local_228,0x200);
        if ((0 < (long)sVar3) && (__n = target->_M_string_length, __n == sVar3)) {
          if (__n == 0) {
            return;
          }
          iVar1 = bcmp((target->_M_dataplus)._M_p,local_228,__n);
          if (iVar1 == 0) {
            return;
          }
        }
        (ec->ec).val_ = 0x11;
        (ec->ec).failed_ = true;
      }
      else {
        (ec->ec).val_ = iVar1;
        (ec->ec).failed_ = iVar1 != 0;
      }
      (ec->ec).cat_ =
           &boost::system::detail::cat_holder<void>::generic_category_instance.super_error_category;
      ec->operation = symlink;
    }
  }
  else {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    (ec->ec).val_ = iVar1;
    (ec->ec).failed_ = iVar1 != 0;
    (ec->ec).cat_ =
         &boost::system::detail::cat_holder<void>::generic_category_instance.super_error_category;
    ec->operation = mkdir;
  }
  return;
}

Assistant:

void create_symlink(std::string const& target, std::string const& link, storage_error& ec)
	{
#if TORRENT_HAS_SYMLINK
		create_directories(parent_path(link), ec.ec);
		if (ec)
		{
			ec.ec = error_code(errno, generic_category());
			ec.operation = operation_t::mkdir;
			return;
		}
		if (::symlink(target.c_str(), link.c_str()) != 0)
		{
			int const error = errno;
			if (error == EEXIST)
			{
				// if the file exist, it may be a symlink already. if so,
				// just verify the link target is what it's supposed to be
				// note that readlink() does not null terminate the buffer
				char buffer[512];
				auto const ret = ::readlink(link.c_str(), buffer, sizeof(buffer));
				if (ret <= 0 || target != string_view(buffer, std::size_t(ret)))
				{
					ec.ec = error_code(error, generic_category());
					ec.operation = operation_t::symlink;
					return;
				}
			}
			else
			{
				ec.ec = error_code(error, generic_category());
				ec.operation = operation_t::symlink;
				return;
			}
		}
#else
		TORRENT_UNUSED(target);
		TORRENT_UNUSED(link);
		TORRENT_UNUSED(ec);
#endif
	}